

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O2

ConversionSchema * __thiscall
Assimp::STEP::EXPRESS::ConversionSchema::operator=
          (ConversionSchema *this,SchemaEntry (*schemas) [980])

{
  mapped_type p_Var1;
  mapped_type *pp_Var2;
  long lVar3;
  allocator<char> local_51;
  key_type local_50;
  
  for (lVar3 = 8; lVar3 != 0x3d48; lVar3 = lVar3 + 0x10) {
    p_Var1 = *(mapped_type *)((long)&(*schemas)[0].mName + lVar3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,*(char **)((long)&schemas[-1][0x3d3].mFunc + lVar3),&local_51);
    pp_Var2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>_>
              ::operator[](&this->converters,&local_50);
    *pp_Var2 = p_Var1;
    std::__cxx11::string::~string((string *)&local_50);
  }
  return this;
}

Assistant:

const ConversionSchema& operator=( const SchemaEntry (& schemas)[N]) {
                for(size_t i = 0; i < N; ++i ) {
                    const SchemaEntry& schema = schemas[i];
                    converters[schema.mName] = schema.mFunc;
                }
                return *this;
            }